

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testinplacetext.cpp
# Opt level: O2

void Am_Inplace_Editor_Do_proc(Am_Object *inter)

{
  Am_Value *pAVar1;
  undefined8 *puVar2;
  Am_Object feedback;
  Am_Object local_30;
  Am_Object_Method method;
  
  pAVar1 = (Am_Value *)Am_Object::Get(0xd088,0xca);
  Am_Object_Method::Am_Object_Method(&method,pAVar1);
  Am_Object::Am_Object(&local_30,inter);
  (*method.Call)((Am_Object_Data *)&local_30);
  Am_Object::~Am_Object(&local_30);
  Am_Object::Get_Owner(&feedback,(Am_Slot_Flags)inter);
  Am_Object::Set((ushort)&feedback,true,0);
  pAVar1 = (Am_Value *)Am_Object::Get((ushort)&feedback,(ulong)Am_INPLACE_TEXT_INFO);
  puVar2 = (undefined8 *)Am_Value::operator_cast_to_void_(pAVar1);
  (**(code **)*puVar2)(puVar2);
  Am_Object::~Am_Object(&feedback);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, Am_Inplace_Editor_Do,
                 (Am_Object inter))
{
  Am_Object_Method method = Am_Text_Edit_Interactor.Get(Am_DO_METHOD);
  method.Call(inter); // Call prototype method.

  Am_Object feedback = inter.Get_Owner();
  feedback.Set(Am_VISIBLE, false);
  Am_Text_Info *text_info =
      Am_Text_Info::Narrow((Am_Ptr)feedback.Get(Am_INPLACE_TEXT_INFO));
  text_info->Release();
}